

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

string * __thiscall
s2textformat::ToString_abi_cxx11_
          (string *__return_storage_ptr__,s2textformat *this,S2ShapeIndex *index)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int e;
  ulong uVar9;
  int local_98;
  S2Point local_60;
  S2Point local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar7 = 0;
  do {
    if (iVar7 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    iVar2 = (**(code **)(*(long *)this + 0x10))(this);
    local_98 = 0;
    bVar1 = false;
    if (iVar2 != 0) {
      iVar8 = 0;
      do {
        plVar5 = (long *)(**(code **)(*(long *)this + 0x18))(this);
        if ((plVar5 != (long *)0x0) &&
           (iVar3 = (**(code **)(*plVar5 + 0x20))(plVar5), iVar3 == iVar7)) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          for (iVar3 = 0; iVar4 = (**(code **)(*plVar5 + 0x30))(plVar5), iVar3 < iVar4;
              iVar3 = iVar3 + 1) {
            if (iVar3 != 0) {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            uVar6 = (**(code **)(*plVar5 + 0x38))(plVar5,iVar3);
            uVar9 = uVar6 & 0xffffffff;
            if (uVar6 >> 0x20 == 0) {
              if (iVar7 != 2) {
                S2LogMessage::S2LogMessage
                          ((S2LogMessage *)&local_60,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
                           ,0x1e7,kFatal,(ostream *)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_60.c_[1],"Check failed: (dim) == (2) ",0x1b);
                abort();
              }
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            else {
              (**(code **)(*plVar5 + 0x18))(&local_60,plVar5,uVar9);
              AppendVertex(&local_60,__return_storage_ptr__);
            }
            iVar4 = (int)(uVar6 >> 0x20);
            if ((int)uVar6 < (int)(-(uint)(iVar7 != 1) + (int)uVar6 + iVar4)) {
              iVar4 = iVar4 + -(uint)(iVar7 != 1);
              do {
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                (**(code **)(*plVar5 + 0x18))(&local_60,plVar5,uVar9);
                AppendVertex(&local_48,__return_storage_ptr__);
                uVar9 = (ulong)((int)uVar9 + 1);
                iVar4 = iVar4 + -1;
              } while (iVar4 != 0);
            }
            local_98 = local_98 + 1;
          }
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 != iVar2);
      bVar1 = 0 < local_98;
    }
    if ((iVar7 == 1) || ((bool)(iVar7 == 0 & bVar1))) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 3);
  return __return_storage_ptr__;
}

Assistant:

string ToString(const S2ShapeIndex& index) {
  string out;
  for (int dim = 0; dim < 3; ++dim) {
    if (dim > 0) out += "#";
    int count = 0;
    for (S2Shape* shape : index) {
      if (shape == nullptr || shape->dimension() != dim) continue;
      out += (count > 0) ? " | " : (dim > 0) ? " " : "";
      for (int i = 0; i < shape->num_chains(); ++i, ++count) {
        if (i > 0) out += (dim == 2) ? "; " : " | ";
        S2Shape::Chain chain = shape->chain(i);
        if (chain.length == 0) {
          S2_DCHECK_EQ(dim, 2);
          out += "full";
        } else {
          AppendVertex(shape->edge(chain.start).v0, &out);
        }
        int limit = chain.start + chain.length;
        if (dim != 1) --limit;
        for (int e = chain.start; e < limit; ++e) {
          out += ", ";
          AppendVertex(shape->edge(e).v1, &out);
        }
      }
    }
    // Example output: "# #", "0:0 # #", "# # 0:0, 0:1, 1:0"
    if (dim == 1 || (dim == 0 && count > 0)) out += " ";
  }
  return out;
}